

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9703::MemoryMappedFileTest_MapZeroTerminated_Test::
~MemoryMappedFileTest_MapZeroTerminated_Test(MemoryMappedFileTest_MapZeroTerminated_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, MapZeroTerminated) {
  const char *content = "some content";
  std::string filename = GetExecutableDir() + "/test";
  WriteFile(filename, content);
  File file(filename, File::RDONLY);
  MemoryMappedFile<> f(file, static_cast<std::size_t>(file.size()));
  EXPECT_STREQ(content, f.start());
  EXPECT_EQ(std::strlen(content), f.size());
}